

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cc
# Opt level: O2

char __thiscall mcc::Scanner::Next(Scanner *this)

{
  Scanner *this_00;
  ErrorReporter *pEVar1;
  int iVar2;
  char cVar3;
  shared_ptr<mcc::Token> token;
  allocator<char> local_61;
  ErrorReporter *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  
  cVar3 = this->putback_;
  if (cVar3 == '\0') {
    iVar2 = fgetc((FILE *)this->source_stream_);
    if ((char)iVar2 == -1) {
      return -1;
    }
    this_00 = (Scanner *)(local_58 + 1);
    while (cVar3 = (char)iVar2, cVar3 == '#') {
      GetToken((Scanner *)&local_60);
      if (*(int *)((long)&(local_60->input_file_)._M_string_length + 4) != 0x2e) {
        pEVar1 = this->reporter_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)this_00,"Invalid preprocessor output",&local_61);
        ErrorReporter::Report(pEVar1,(string *)this_00,'#',this->line_,this->c_);
        std::__cxx11::string::~string((string *)this_00);
      }
      iVar2 = *(int *)((long)&(local_60->input_file_)._M_dataplus._M_p + 4);
      GetToken(this_00);
      std::__shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2> *)&local_60,
                 (__shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
      if (*(int *)((long)&(local_60->input_file_)._M_string_length + 4) != 0x2f) {
        pEVar1 = this->reporter_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)this_00,"Invalid preprocessor output",&local_61);
        ErrorReporter::Report(pEVar1,(string *)this_00,'#',this->line_,this->c_);
        std::__cxx11::string::~string((string *)this_00);
      }
      if (**(char **)&(local_60->input_file_).field_2 != '<') {
        std::__cxx11::string::_M_assign((string *)this->reporter_);
        this->line_ = iVar2;
      }
      do {
        iVar2 = fgetc((FILE *)this->source_stream_);
      } while ((char)iVar2 != '\n');
      iVar2 = fgetc((FILE *)this->source_stream_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    }
    iVar2 = this->c_ + 1;
  }
  else {
    this->putback_ = '\0';
    iVar2 = this->c_;
    this->c_ = iVar2 + -1;
  }
  this->c_ = iVar2;
  if (cVar3 == '\n') {
    this->line_ = this->line_ + 1;
    this->c_ = 0;
    cVar3 = '\n';
  }
  return cVar3;
}

Assistant:

char Scanner::Next() {
  char c;

  if (putback_ != '\0') {
    c = putback_;
    putback_ = '\0';
    c_--;
  } else {
    c = (char) fgetc(source_stream_);
    if (c == EOF) { // eof
      return EOF;
    }

    while (c == '#') { // preprocessor lines
      std::shared_ptr<Token> token = GetToken();
      if (token->GetType() != TokenType::T_INT_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      int line = token->Int();

      token = GetToken();
      if (token->GetType() != TokenType::T_STR_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      if (token->String()[0] != '<') {
        reporter_.SetFile(token->String());
        line_ = line;
      }

      while ((c = (char) fgetc(source_stream_)) != '\n');
      c = (char) fgetc(source_stream_);
    }
  }

  c_++;
  if (c == '\n') {
    line_++;
    c_ = 0;
  }

  return c;
}